

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::ProxyEndpoint::Send
          (Error *__return_storage_ptr__,ProxyEndpoint *this,ByteArray *aRequest,
          MessageSubType aSubType)

{
  string *__rhs;
  char cVar1;
  ErrorCode EVar2;
  type tVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar8;
  format_args args;
  format_args args_00;
  ByteArray udpPayload;
  writer write;
  Request udpTx;
  undefined1 local_180 [8];
  uchar *local_178;
  char local_170 [8];
  uchar local_168 [16];
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  size_t local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  parse_func local_130 [1];
  ByteArray local_128;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  writer local_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined8 uStack_c0;
  Message local_b8;
  
  __return_storage_ptr__->mCode = kNone;
  __rhs = &__return_storage_ptr__->mMessage;
  local_e8 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_e8;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  coap::Message::Message(&local_b8,kNonConfirmable,kPost);
  local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_Endpoint)._vptr_Endpoint[3])((format_string_checker<char> *)local_158,this);
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(local_158._4_4_,local_158._0_4_);
  if (paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_p) {
    bVar8 = true;
  }
  else {
    (*(this->super_Endpoint)._vptr_Endpoint[3])(local_180,this);
    bVar8 = (long)local_178 - (long)local_180 != 0x10;
    if (local_180 != (undefined1  [8])0x0) {
      operator_delete((void *)local_180);
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(local_158._4_4_,local_158._0_4_);
  }
  if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    operator_delete(paVar7);
  }
  if (bVar8) {
    local_158._0_4_ = none_type;
    local_150._M_p = "no valid IPv6 peer address";
    local_148 = 0x1a;
    local_140._M_allocated_capacity = 0;
    local_130[0] = (parse_func)0x0;
    pcVar6 = "no valid IPv6 peer address";
    local_140._8_8_ = (format_string_checker<char> *)local_158;
    do {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_158);
      }
      pcVar6 = pcVar5;
    } while (pcVar5 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_158;
    fmt::v10::vformat_abi_cxx11_
              (&local_108,(v10 *)"no valid IPv6 peer address",(string_view)ZEXT816(0x1a),args);
    local_180._0_4_ = 0xf;
    local_178 = local_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,local_108._M_dataplus._M_p,
               local_108._M_dataplus._M_p + local_108._M_string_length);
  }
  else {
    if ((this->mBrClient->mDtlsSession).mState == kConnected) {
      utils::Encode<unsigned_short>(&local_128,0xf0bf);
      iVar4 = (*(this->super_Endpoint)._vptr_Endpoint[4])(this);
      utils::Encode<unsigned_short>(&local_128,(unsigned_short)iVar4);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_128,
                 local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 (aRequest->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start);
      local_180 = (undefined1  [8])local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"/c/ut","");
      coap::Message::SetUriPath((Error *)local_158,&local_b8,(string *)local_180);
      __return_storage_ptr__->mCode = local_158._0_4_;
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_150);
      EVar2 = __return_storage_ptr__->mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_p != &local_140) {
        operator_delete(local_150._M_p);
      }
      if (local_180 != (undefined1  [8])local_170) {
        operator_delete((void *)local_180);
      }
      if (EVar2 == kNone) {
        tlv::Tlv::Tlv((Tlv *)local_180,kIpv6Address,&(this->mPeerAddr).mBytes,kMeshCoP);
        AppendTlv((Error *)local_158,&local_b8,(Tlv *)local_180);
        __return_storage_ptr__->mCode = local_158._0_4_;
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_150);
        EVar2 = __return_storage_ptr__->mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p);
        }
        if (local_178 != (uchar *)0x0) {
          operator_delete(local_178);
        }
        if (EVar2 == kNone) {
          tlv::Tlv::Tlv((Tlv *)local_180,kUdpEncapsulation,&local_128,kMeshCoP);
          AppendTlv((Error *)local_158,&local_b8,(Tlv *)local_180);
          __return_storage_ptr__->mCode = local_158._0_4_;
          std::__cxx11::string::operator=((string *)__rhs,(string *)&local_150);
          EVar2 = __return_storage_ptr__->mCode;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_p != &local_140) {
            operator_delete(local_150._M_p);
          }
          if (local_178 != (uchar *)0x0) {
            operator_delete(local_178);
          }
          if (EVar2 == kNone) {
            local_c8 = (code *)0x0;
            uStack_c0 = 0;
            local_d8._M_unused._M_object = (void *)0x0;
            local_d8._8_8_ = 0;
            coap::CoapSecure::SendRequest(this->mBrClient,&local_b8,(ResponseHandler *)&local_d8);
            if (local_c8 != (code *)0x0) {
              (*local_c8)(&local_d8,&local_d8,__destroy_functor);
            }
          }
        }
      }
      goto LAB_001c7cb0;
    }
    local_158._0_4_ = none_type;
    pcVar6 = "not connected to the border agent";
    local_150._M_p = "not connected to the border agent";
    local_148 = 0x21;
    local_140._M_allocated_capacity = 0;
    local_130[0] = (parse_func)0x0;
    local_140._8_8_ = (format_string_checker<char> *)local_158;
    local_e0.handler_ = (format_string_checker<char> *)local_158;
    do {
      cVar1 = *pcVar6;
      pcVar5 = pcVar6;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_e0,pcVar6,"");
          goto LAB_001c7c27;
        }
        cVar1 = *pcVar5;
      }
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_e0,pcVar6,pcVar5);
      pcVar6 = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",(format_string_checker<char> *)local_158);
    } while (pcVar6 != "");
LAB_001c7c27:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_158;
    fmt::v10::vformat_abi_cxx11_
              (&local_108,(v10 *)"not connected to the border agent",(string_view)ZEXT816(0x21),
               args_00);
    local_180._0_4_ = 0xf;
    local_178 = local_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,local_108._M_dataplus._M_p,
               local_108._M_dataplus._M_p + local_108._M_string_length);
  }
  __return_storage_ptr__->mCode = local_180._0_4_;
  std::__cxx11::string::operator=((string *)__rhs,(string *)&local_178);
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
LAB_001c7cb0:
  tVar3 = __return_storage_ptr__->mCode;
  if (tVar3 != none_type) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   "sending UDP_TX.ntf message failed, ",__rhs);
    local_158._0_4_ = tVar3;
    local_150._M_p = (pointer)&local_140;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,local_180,local_178 + (long)local_180);
    __return_storage_ptr__->mCode = local_158._0_4_;
    std::__cxx11::string::operator=((string *)__rhs,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_p != &local_140) {
      operator_delete(local_150._M_p);
    }
    if (local_180 != (undefined1  [8])local_170) {
      operator_delete((void *)local_180);
    }
  }
  if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  return __return_storage_ptr__;
}

Assistant:

Error ProxyEndpoint::Send(const ByteArray &aRequest, MessageSubType aSubType)
{
    Error         error;
    coap::Request udpTx{coap::Type::kNonConfirmable, coap::Code::kPost};
    ByteArray     udpPayload;

    (void)aSubType;

    VerifyOrExit(GetPeerAddr().IsValid() && GetPeerAddr().IsIpv6(),
                 error = ERROR_INVALID_STATE("no valid IPv6 peer address"));

    VerifyOrExit(mBrClient.IsConnected(), error = ERROR_INVALID_STATE("not connected to the border agent"));

    // set the source port to default mamagement port for UDP_Tx message
    utils::Encode<uint16_t>(udpPayload, kDefaultMmPort);
    utils::Encode<uint16_t>(udpPayload, GetPeerPort());
    udpPayload.insert(udpPayload.end(), aRequest.begin(), aRequest.end());

    SuccessOrExit(error = udpTx.SetUriPath(uri::kUdpTx));
    SuccessOrExit(error = AppendTlv(udpTx, {tlv::Type::kIpv6Address, mPeerAddr.GetRaw()}));
    SuccessOrExit(error = AppendTlv(udpTx, {tlv::Type::kUdpEncapsulation, udpPayload}));

    mBrClient.SendRequest(udpTx, nullptr);

exit:
    if (error != ErrorCode::kNone)
    {
        error = Error{error.GetCode(), "sending UDP_TX.ntf message failed, " + error.GetMessage()};
    }
    return error;
}